

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_wif_trace.cpp
# Opt level: O0

ssize_t __thiscall
sc_core::wif_sc_signed_trace::write(wif_sc_signed_trace *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  int iVar2;
  size_type __n_00;
  sc_signed *psVar3;
  reference pcVar4;
  undefined4 in_register_00000034;
  int bitindex;
  char *buf_ptr;
  size_t sz;
  FILE *__stream;
  allocator_type *in_stack_ffffffffffffff78;
  sc_signed *in_stack_ffffffffffffff80;
  size_type in_stack_ffffffffffffff88;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  int local_5c;
  char *local_58;
  undefined1 local_4a [56];
  undefined1 local_12 [10];
  wif_sc_signed_trace *local_8;
  
  local_12._2_8_ = CONCAT44(in_register_00000034,__fd);
  local_8 = this;
  if (write(_IO_FILE*)::buf == '\0') {
    iVar2 = __cxa_guard_acquire(&write(_IO_FILE*)::buf);
    if (iVar2 != 0) {
      local_12[1] = 0;
      in_stack_ffffffffffffff90 = (vector<char,_std::allocator<char>_> *)local_12;
      std::allocator<char>::allocator();
      std::vector<char,_std::allocator<char>_>::vector
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                 (value_type_conflict *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      std::allocator<char>::~allocator((allocator<char> *)local_12);
      __cxa_atexit(std::vector<char,_std::allocator<char>_>::~vector,&write::buf,&__dso_handle);
      __cxa_guard_release(&write(_IO_FILE*)::buf);
    }
  }
  __n_00 = std::vector<char,_std::allocator<char>_>::size(&write::buf);
  iVar2 = sc_dt::sc_signed::length(this->object);
  if (__n_00 <= (ulong)(long)iVar2) {
    iVar2 = sc_dt::sc_signed::length(this->object);
    in_stack_ffffffffffffff78 = (allocator_type *)((long)iVar2 + 0x1000U & 0xfffffffffffff000);
    local_4a[1] = 0;
    in_stack_ffffffffffffff80 = (sc_signed *)local_4a;
    local_4a._26_8_ = in_stack_ffffffffffffff78;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              (in_stack_ffffffffffffff90,__n_00,(value_type_conflict *)in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff78);
    std::vector<char,_std::allocator<char>_>::swap
              ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff80,
               (vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff78);
    std::vector<char,_std::allocator<char>_>::~vector(in_stack_ffffffffffffff90);
    std::allocator<char>::~allocator((allocator<char> *)local_4a);
  }
  local_58 = std::vector<char,_std::allocator<char>_>::operator[](&write::buf,0);
  local_5c = sc_dt::sc_signed::length(this->object);
  while (local_5c = local_5c + -1, -1 < local_5c) {
    sc_dt::sc_signed::operator[]
              (in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    bVar1 = sc_dt::sc_signed_bitref_r::to_bool((sc_signed_bitref_r *)0x2e3c7a);
    *local_58 = "01"[bVar1];
    local_58 = local_58 + 1;
  }
  *local_58 = '\0';
  __stream = (FILE *)local_12._2_8_;
  psVar3 = (sc_signed *)std::__cxx11::string::c_str();
  pcVar4 = std::vector<char,_std::allocator<char>_>::operator[](&write::buf,0);
  fprintf(__stream,"assign %s \"%s\" ;\n",psVar3,pcVar4);
  psVar3 = sc_dt::sc_signed::operator=(psVar3,(sc_signed *)__stream);
  return (ssize_t)psVar3;
}

Assistant:

void wif_sc_signed_trace::write(FILE* f)
{
    static std::vector<char> buf(1024);
    typedef std::vector<char>::size_type size_t;

    if ( buf.size() <= static_cast<size_t>(object.length()) ) { // include trailing \0
        size_t sz = ( static_cast<size_t>(object.length()) + 4096 ) & (~static_cast<size_t>(4096-1));
        std::vector<char>( sz ).swap( buf ); // resize without copying values
    }
    char *buf_ptr = &buf[0];

    for(int bitindex = object.length() - 1; bitindex >= 0; --bitindex) {
        *buf_ptr++ = "01"[object[bitindex].to_bool()];
    }
    *buf_ptr = '\0';

    std::fprintf(f, "assign %s \"%s\" ;\n", wif_name.c_str(), &buf[0]);
    old_value = object;
}